

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O3

void unpackforblock20(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pout;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  uVar7 = puVar1[4];
  uVar8 = puVar1[5];
  uVar9 = puVar1[6];
  uVar10 = puVar1[7];
  uVar11 = puVar1[8];
  uVar12 = puVar1[9];
  *pw = (uint8_t *)(puVar1 + 10);
  *puVar2 = ((uint)uVar3 & 0xfffff) + base;
  uVar13 = (uint)(uVar3 >> 0x20);
  puVar2[1] = ((uint)(uVar3 >> 0x14) & 0xfffff) + base;
  puVar2[2] = (uVar13 >> 8 & 0xfffff) + base;
  puVar2[3] = ((uint)(uVar4 << 4) & 0xfffff | uVar13 >> 0x1c) + base;
  puVar2[4] = ((uint)(uVar4 >> 0x10) & 0xfffff) + base;
  puVar2[5] = ((uint)(uVar4 >> 0x24) & 0xfffff) + base;
  puVar2[6] = ((uint)(uVar5 << 8) & 0xfffff | (uint)(byte)(uVar4 >> 0x38)) + base;
  puVar2[7] = ((uint)(uVar5 >> 0xc) & 0xfffff) + base;
  uVar13 = (uint)(uVar5 >> 0x20);
  puVar2[8] = (uVar13 & 0xfffff) + base;
  puVar2[9] = ((uint)(uVar6 << 0xc) & 0xfffff | uVar13 >> 0x14) + base;
  puVar2[10] = ((uint)(uVar6 >> 8) & 0xfffff) + base;
  puVar2[0xb] = ((uint)(uVar6 >> 0x1c) & 0xfffff) + base;
  puVar2[0xc] = ((uint)(uVar7 << 0x10) & 0xfffff | (uint)(ushort)(uVar6 >> 0x30)) + base;
  puVar2[0xd] = ((uint)(uVar7 >> 4) & 0xfffff) + base;
  puVar2[0xe] = ((uint)(uVar7 >> 0x18) & 0xfffff) + base;
  puVar2[0xf] = (uint)(uVar7 >> 0x2c) + base;
  puVar2[0x10] = ((uint)uVar8 & 0xfffff) + base;
  uVar13 = (uint)(uVar8 >> 0x20);
  puVar2[0x11] = ((uint)(uVar8 >> 0x14) & 0xfffff) + base;
  puVar2[0x12] = (uVar13 >> 8 & 0xfffff) + base;
  puVar2[0x13] = ((uint)(uVar9 << 4) & 0xfffff | uVar13 >> 0x1c) + base;
  puVar2[0x14] = ((uint)(uVar9 >> 0x10) & 0xfffff) + base;
  puVar2[0x15] = ((uint)(uVar9 >> 0x24) & 0xfffff) + base;
  puVar2[0x16] = ((uint)(uVar10 << 8) & 0xfffff | (uint)(byte)(uVar9 >> 0x38)) + base;
  puVar2[0x17] = ((uint)(uVar10 >> 0xc) & 0xfffff) + base;
  uVar13 = (uint)(uVar10 >> 0x20);
  puVar2[0x18] = (uVar13 & 0xfffff) + base;
  puVar2[0x19] = ((uint)(uVar11 << 0xc) & 0xfffff | uVar13 >> 0x14) + base;
  puVar2[0x1a] = ((uint)(uVar11 >> 8) & 0xfffff) + base;
  puVar2[0x1b] = ((uint)(uVar11 >> 0x1c) & 0xfffff) + base;
  puVar2[0x1c] = ((uint)(uVar12 << 0x10) & 0xfffff | (uint)(ushort)(uVar11 >> 0x30)) + base;
  puVar2[0x1d] = ((uint)(uVar12 >> 4) & 0xfffff) + base;
  puVar2[0x1e] = ((uint)(uVar12 >> 0x18) & 0xfffff) + base;
  puVar2[0x1f] = (uint)(uVar12 >> 0x2c) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock20(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(1048575);
  /* we are going to access  10 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  *pw += 80; /* we used up 80 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 20) & mask);
  out[2] = base + (uint32_t)((w0 >> 40) & mask);
  out[3] = base + (uint32_t)(((w0 >> 60) | (w1 << 4)) & mask);
  out[4] = base + (uint32_t)((w1 >> 16) & mask);
  out[5] = base + (uint32_t)((w1 >> 36) & mask);
  out[6] = base + (uint32_t)(((w1 >> 56) | (w2 << 8)) & mask);
  out[7] = base + (uint32_t)((w2 >> 12) & mask);
  out[8] = base + (uint32_t)((w2 >> 32) & mask);
  out[9] = base + (uint32_t)(((w2 >> 52) | (w3 << 12)) & mask);
  out[10] = base + (uint32_t)((w3 >> 8) & mask);
  out[11] = base + (uint32_t)((w3 >> 28) & mask);
  out[12] = base + (uint32_t)(((w3 >> 48) | (w4 << 16)) & mask);
  out[13] = base + (uint32_t)((w4 >> 4) & mask);
  out[14] = base + (uint32_t)((w4 >> 24) & mask);
  out[15] = base + (uint32_t)(w4 >> 44);
  out[16] = base + (uint32_t)((w5)&mask);
  out[17] = base + (uint32_t)((w5 >> 20) & mask);
  out[18] = base + (uint32_t)((w5 >> 40) & mask);
  out[19] = base + (uint32_t)(((w5 >> 60) | (w6 << 4)) & mask);
  out[20] = base + (uint32_t)((w6 >> 16) & mask);
  out[21] = base + (uint32_t)((w6 >> 36) & mask);
  out[22] = base + (uint32_t)(((w6 >> 56) | (w7 << 8)) & mask);
  out[23] = base + (uint32_t)((w7 >> 12) & mask);
  out[24] = base + (uint32_t)((w7 >> 32) & mask);
  out[25] = base + (uint32_t)(((w7 >> 52) | (w8 << 12)) & mask);
  out[26] = base + (uint32_t)((w8 >> 8) & mask);
  out[27] = base + (uint32_t)((w8 >> 28) & mask);
  out[28] = base + (uint32_t)(((w8 >> 48) | (w9 << 16)) & mask);
  out[29] = base + (uint32_t)((w9 >> 4) & mask);
  out[30] = base + (uint32_t)((w9 >> 24) & mask);
  out[31] = base + (uint32_t)(w9 >> 44);
  *pout += 32; /* we wrote 32 32-bit integers */
}